

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::EnsureVkCmdBuffer(DeviceContextVkImpl *this)

{
  VkPipelineStageFlags StageMask;
  VkAccessFlags AccessMask;
  Char *Message;
  VkCommandBuffer pVVar1;
  char (*in_RCX) [21];
  Uint32 local_5c;
  VkCommandBuffer vkCmdBuff;
  undefined1 local_30 [8];
  string msg;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_CmdPool == (VulkanCommandBufferPool *)0x0) {
    FormatString<char[26],char[21]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_CmdPool != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"EnsureVkCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x1c4);
    std::__cxx11::string::~string((string *)local_30);
  }
  if ((this->m_State).NumCommands == 0) {
    local_5c = 1;
  }
  else {
    local_5c = (this->m_State).NumCommands;
  }
  (this->m_State).NumCommands = local_5c;
  pVVar1 = VulkanUtilities::VulkanCommandBuffer::GetVkCmdBuffer(&this->m_CommandBuffer);
  if (pVVar1 == (VkCommandBuffer)0x0) {
    pVVar1 = VulkanUtilities::VulkanCommandBufferPool::GetCommandBuffer(this->m_CmdPool,"");
    StageMask = VulkanUtilities::VulkanCommandBufferPool::GetSupportedStagesMask(this->m_CmdPool);
    AccessMask = VulkanUtilities::VulkanCommandBufferPool::GetSupportedAccessMask(this->m_CmdPool);
    VulkanUtilities::VulkanCommandBuffer::SetVkCmdBuffer
              (&this->m_CommandBuffer,pVVar1,StageMask,AccessMask);
  }
  return;
}

Assistant:

__forceinline void EnsureVkCmdBuffer()
    {
        VERIFY_EXPR(m_CmdPool != nullptr);

        // Make sure that the number of commands in the context is at least one,
        // so that the context cannot be disposed by Flush()
        m_State.NumCommands = m_State.NumCommands != 0 ? m_State.NumCommands : 1;
        if (m_CommandBuffer.GetVkCmdBuffer() == VK_NULL_HANDLE)
        {
            VkCommandBuffer vkCmdBuff = m_CmdPool->GetCommandBuffer();
            m_CommandBuffer.SetVkCmdBuffer(vkCmdBuff, m_CmdPool->GetSupportedStagesMask(), m_CmdPool->GetSupportedAccessMask());
        }
    }